

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_frameProgression *
ZSTDMT_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTDMT_CCtx *mtctx)

{
  ZSTDMT_jobDescription *pZVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_long_long uVar7;
  uint uVar8;
  uint uVar9;
  ZSTDMT_jobDescription *pZVar10;
  unsigned_long_long uVar11;
  unsigned_long_long local_58;
  unsigned_long_long local_50;
  
  uVar11 = mtctx->consumed;
  __return_storage_ptr__->ingested = (mtctx->inBuff).filled + uVar11;
  __return_storage_ptr__->consumed = uVar11;
  uVar11 = mtctx->produced;
  __return_storage_ptr__->flushed = uVar11;
  __return_storage_ptr__->produced = uVar11;
  uVar5 = mtctx->nextJobID;
  __return_storage_ptr__->currentJobID = uVar5;
  __return_storage_ptr__->nbActiveWorkers = 0;
  if (1 < mtctx->jobReady) {
    __assert_fail("mtctx->jobReady <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x892b,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
  }
  uVar5 = mtctx->jobReady + uVar5;
  uVar8 = mtctx->doneJobID;
  uVar11 = __return_storage_ptr__->ingested;
  uVar7 = __return_storage_ptr__->consumed;
  local_58 = __return_storage_ptr__->produced;
  local_50 = __return_storage_ptr__->flushed;
  uVar9 = __return_storage_ptr__->nbActiveWorkers;
  if (uVar8 < uVar5) {
    do {
      uVar3 = mtctx->jobIDMask & uVar8;
      pZVar1 = mtctx->jobs;
      pZVar10 = pZVar1 + uVar3;
      pthread_mutex_lock((pthread_mutex_t *)&pZVar1[uVar3].job_mutex);
      uVar4 = pZVar1[uVar3].cSize;
      uVar6 = 0;
      if (uVar4 < 0xffffffffffffff89) {
        uVar6 = pZVar10->dstFlushed;
      }
      else {
        uVar4 = 0;
      }
      if (uVar4 < uVar6) {
        __return_storage_ptr__->ingested = uVar11;
        __return_storage_ptr__->consumed = uVar7;
        __return_storage_ptr__->produced = local_58;
        __return_storage_ptr__->flushed = local_50;
        __return_storage_ptr__->nbActiveWorkers = uVar9;
        __assert_fail("flushed <= produced",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8935,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
      }
      uVar2 = (pZVar10->src).size;
      uVar11 = uVar11 + uVar2;
      uVar7 = uVar7 + pZVar10->consumed;
      local_58 = local_58 + uVar4;
      local_50 = local_50 + uVar6;
      uVar9 = uVar9 + (pZVar10->consumed < uVar2);
      pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar3].job_mutex);
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  __return_storage_ptr__->ingested = uVar11;
  __return_storage_ptr__->consumed = uVar7;
  __return_storage_ptr__->produced = local_58;
  __return_storage_ptr__->flushed = local_50;
  __return_storage_ptr__->nbActiveWorkers = uVar9;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx* mtctx)
{
    ZSTD_frameProgression fps;
    DEBUGLOG(5, "ZSTDMT_getFrameProgression");
    fps.ingested = mtctx->consumed + mtctx->inBuff.filled;
    fps.consumed = mtctx->consumed;
    fps.produced = fps.flushed = mtctx->produced;
    fps.currentJobID = mtctx->nextJobID;
    fps.nbActiveWorkers = 0;
    {   unsigned jobNb;
        unsigned lastJobNb = mtctx->nextJobID + mtctx->jobReady; assert(mtctx->jobReady <= 1);
        DEBUGLOG(6, "ZSTDMT_getFrameProgression: jobs: from %u to <%u (jobReady:%u)",
                    mtctx->doneJobID, lastJobNb, mtctx->jobReady)
        for (jobNb = mtctx->doneJobID ; jobNb < lastJobNb ; jobNb++) {
            unsigned const wJobID = jobNb & mtctx->jobIDMask;
            ZSTDMT_jobDescription* jobPtr = &mtctx->jobs[wJobID];
            ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
            {   size_t const cResult = jobPtr->cSize;
                size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
                size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
                assert(flushed <= produced);
                fps.ingested += jobPtr->src.size;
                fps.consumed += jobPtr->consumed;
                fps.produced += produced;
                fps.flushed  += flushed;
                fps.nbActiveWorkers += (jobPtr->consumed < jobPtr->src.size);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        }
    }
    return fps;
}